

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.h
# Opt level: O3

pair<__gnu_cxx::__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_bool>
 __thiscall
perfetto::base::FlatSet<unsigned_long>::insert(FlatSet<unsigned_long> *this,unsigned_long value)

{
  const_iterator cVar1;
  unsigned_long *puVar2;
  const_iterator __position;
  undefined8 extraout_RDX;
  undefined8 uVar3;
  ulong uVar4;
  ulong uVar5;
  pair<__gnu_cxx::__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_bool>
  pVar6;
  unsigned_long local_8;
  
  cVar1._M_current =
       (this->entries_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_start;
  puVar2 = (this->entries_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  uVar5 = (long)puVar2 - (long)cVar1._M_current >> 3;
  while (__position._M_current = cVar1._M_current, 0 < (long)uVar5) {
    uVar4 = uVar5 >> 1;
    uVar5 = ~uVar4 + uVar5;
    cVar1._M_current = __position._M_current + uVar4 + 1;
    if (value <= __position._M_current[uVar4]) {
      cVar1._M_current = __position._M_current;
      uVar5 = uVar4;
    }
  }
  if ((__position._M_current == puVar2) || (*__position._M_current != value)) {
    local_8 = value;
    __position._M_current =
         (unsigned_long *)
         ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::_M_insert_rval
                   (&this->entries_,__position,&local_8);
    uVar3 = CONCAT71((int7)((ulong)extraout_RDX >> 8),1);
  }
  else {
    uVar3 = 0;
  }
  pVar6._8_8_ = uVar3;
  pVar6.first._M_current = __position._M_current;
  return pVar6;
}

Assistant:

std::pair<iterator, bool> insert(T value) {
    auto entries_end = entries_.end();
    auto it = std::lower_bound(entries_.begin(), entries_end, value);
    if (it != entries_end && *it == value)
      return std::make_pair(it, false);
    // If the value is not found |it| is either end() or the next item strictly
    // greater than |value|. In both cases we want to insert just before that.
    it = entries_.insert(it, std::move(value));
    return std::make_pair(it, true);
  }